

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Float __thiscall pbrt::SobolSampler::SampleDimension(SobolSampler *this,int dimension)

{
  RandomizeStrategy RVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint32_t uVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  OwenScrambler local_4;
  
  if ((dimension < 2) || (RVar1 = this->randomizeStrategy, RVar1 == None)) {
    if (this->sobolIndex == 0) {
      auVar10 = ZEXT816(0) << 0x40;
      goto LAB_001c178a;
    }
    uVar6 = 0;
    puVar3 = &SobolMatrices32 + dimension * 0x34;
    uVar4 = this->sobolIndex;
    do {
      if ((uVar4 & 1) != 0) {
        uVar6 = uVar6 ^ *puVar3;
      }
      puVar3 = puVar3 + 1;
      bVar8 = 1 < uVar4;
      uVar4 = (long)uVar4 >> 1;
    } while (bVar8);
LAB_001c1654:
    auVar10 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar6);
    fVar9 = auVar10._0_4_;
  }
  else {
    uVar4 = (long)*Options ^ (ulong)(uint)dimension << 0x20;
    uVar4 = (uVar4 >> 0x1f ^ uVar4) * 0x7fb5d329728ea185;
    lVar5 = (uVar4 >> 0x1b ^ uVar4) * -0x7e25210b43d22bb3;
    uVar2 = (uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5;
    uVar4 = this->sobolIndex;
    if (RVar1 == FastOwen) {
      if (uVar4 != 0) {
        do {
          bVar8 = 1 < uVar4;
          uVar4 = (long)uVar4 >> 1;
        } while (bVar8);
      }
      halt_baddata();
    }
    if (RVar1 == PermuteDigits) {
      if (uVar4 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        puVar3 = &SobolMatrices32 + dimension * 0x34;
        do {
          if ((uVar4 & 1) != 0) {
            uVar6 = uVar6 ^ *puVar3;
          }
          puVar3 = puVar3 + 1;
          bVar8 = 1 < uVar4;
          uVar4 = (long)uVar4 >> 1;
        } while (bVar8);
      }
      uVar6 = uVar6 ^ uVar2;
      goto LAB_001c1654;
    }
    if (RVar1 == CranleyPatterson) {
      if (uVar4 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        puVar3 = &SobolMatrices32 + dimension * 0x34;
        do {
          if ((uVar4 & 1) != 0) {
            uVar6 = uVar6 ^ *puVar3;
          }
          puVar3 = puVar3 + 1;
          bVar8 = 1 < uVar4;
          uVar4 = (long)uVar4 >> 1;
        } while (bVar8);
      }
      uVar6 = uVar6 + uVar2;
      goto LAB_001c1654;
    }
    if (uVar4 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      puVar3 = &SobolMatrices32 + dimension * 0x34;
      do {
        if ((uVar4 & 1) != 0) {
          uVar7 = uVar7 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar8 = 1 < uVar4;
        uVar4 = (long)uVar4 >> 1;
      } while (bVar8);
    }
    uVar7 = OwenScrambler::operator()(&local_4,uVar7);
    auVar10 = vcvtusi2ss_avx512f(in_XMM2,uVar7);
    fVar9 = auVar10._0_4_;
  }
  auVar10 = ZEXT416((uint)(fVar9 * 2.3283064e-10));
LAB_001c178a:
  auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar10);
  return auVar10._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float SampleDimension(int dimension) const {
        // Return un-randomized Sobol sample if appropriate
        if (dimension < 2 || randomizeStrategy == RandomizeStrategy::None)
            return SobolSample(sobolIndex, dimension, NoRandomizer());

        // Return randomized Sobol sample using _randomizeStrategy_
        uint32_t hash = MixBits((uint64_t(dimension) << 32) ^ GetOptions().seed);
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            return SobolSample(sobolIndex, dimension, CranleyPattersonRotator(hash));
        else if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
            return SobolSample(sobolIndex, dimension, BinaryPermuteScrambler(hash));
        else if (randomizeStrategy == RandomizeStrategy::FastOwen)
            return SobolSample(sobolIndex, dimension, FastOwenScrambler(hash));
        else
            return SobolSample(sobolIndex, dimension, OwenScrambler(hash));
    }